

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Box.H
# Opt level: O2

IntVect __thiscall amrex::Box::size(Box *this)

{
  IntVect IVar1;
  
  IVar1.vect[0] = ((this->bigend).vect[0] - (this->smallend).vect[0]) + 1;
  IVar1.vect[2] = ((this->bigend).vect[2] - (this->smallend).vect[2]) + 1;
  IVar1.vect[1] = ((this->bigend).vect[1] - (this->smallend).vect[1]) + 1;
  return (IntVect)IVar1.vect;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    IntVect size () const noexcept
    {
        return IntVect(AMREX_D_DECL(bigend[0]-smallend[0] + 1,
                                    bigend[1]-smallend[1] + 1,
                                    bigend[2]-smallend[2] + 1));
    }